

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)16>_> * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::createPipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,
          VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device)

{
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Move<vk::Handle<(vk::HandleType)21>_> *this_01;
  Context *this_02;
  deUint64 dVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  int iVar3;
  VkFormat VVar4;
  VkResult VVar5;
  deUint32 queueFamilyIndex;
  int iVar6;
  DescriptorSetLayoutBuilder *pDVar7;
  DescriptorPoolBuilder *pDVar8;
  Allocator *pAVar9;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar10;
  VkDescriptorSetLayout descriptorSetLayout;
  Vec4 *color;
  ulong size;
  int x;
  long lVar11;
  undefined8 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  VkCommandBufferAllocateInfo cmdBufferAllocateInfo;
  VkBufferCreateInfo bufferParams;
  PixelBufferAccess destAccess;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  undefined8 local_1c0;
  int local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  int local_194;
  PixelBufferAccess access;
  undefined1 local_128 [20];
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined4 local_ec;
  PixelBufferAccess local_e8;
  TextureLevel texture;
  TextureFormat texFormat;
  undefined4 local_90 [2];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  deUint64 local_70;
  undefined8 local_68;
  ulong local_60;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  if (this->m_test == READ_TEXTURE) {
    local_128._0_4_ = 255.0;
    local_128._4_4_ = 0.0;
    local_128._8_4_ = 0.0;
    local_128._12_8_ = 0;
    local_114 = 0x437f0000;
    local_110 = 0;
    uStack_108 = 0;
    local_100 = 0x437f0000;
    local_fc = 0;
    uStack_f4 = 0;
    local_ec = 0x437f0000;
    texFormat = glu::mapGLInternalFormat(0x8058);
    VVar4 = ::vk::mapTextureFormat(&texFormat);
    pAVar9 = Context::getDefaultAllocator
                       ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.
                        m_context);
    tcu::TextureLevel::TextureLevel(&texture,&texFormat,4,1,1);
    tcu::TextureLevel::getAccess(&access,&texture);
    color = (Vec4 *)local_128;
    for (lVar11 = 0; lVar11 < texture.m_size.m_data[0]; lVar11 = lVar11 + 1) {
      tcu::PixelBufferAccess::setPixel(&access,color,(int)lVar11,0,0);
      color = color + 1;
    }
    access.super_ConstPixelBufferAccess.m_format.order = sRGB;
    access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    access.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 1;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 4;
    access.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
    stack0xfffffffffffffe9c = 0x100000001;
    access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = VVar4;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&cmdBufferAllocateInfo,vk,device,
                      (VkImageCreateInfo *)&access,(VkAllocationCallbacks *)0x0);
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    this_00 = &this->m_texture;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)bufferParams._16_8_;
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)bufferParams.size;
    (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         bufferParams._0_8_;
    (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&cmdBufferAllocateInfo);
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)&bufferParams,vk,device,
               (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                        m_internal);
    (*pAVar9->_vptr_Allocator[3])(&cmdBufferAllocateInfo,pAVar9,&bufferParams,0);
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    data._8_4_ = in_stack_fffffffffffffc60;
    data.ptr = (Allocation *)in_stack_fffffffffffffc58;
    data._12_4_ = in_stack_fffffffffffffc64;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&(this->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &cmdBufferAllocateInfo);
    VVar5 = (*vk->_vptr_DeviceInterface[0xd])
                      (vk,device,
                       (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                       m_internal,
                       (((this->m_allocation).
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                         m_data.ptr)->m_memory).m_internal);
    ::vk::checkResult(VVar5,
                      "vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x199);
    this_02 = (this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context;
    tcu::TextureLevel::getAccess(&local_e8,&texture);
    dVar2 = (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
    vk_00 = Context::getDeviceInterface(this_02);
    device_00 = Context::getDevice(this_02);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this_02);
    pVVar10 = Context::getUniversalQueue(this_02);
    pAVar9 = Context::getDefaultAllocator(this_02);
    iVar3 = local_e8.super_ConstPixelBufferAccess.m_size.m_data[0];
    iVar6 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_e8);
    size = (ulong)(uint)(local_e8.super_ConstPixelBufferAccess.m_size.m_data[2] * iVar6 *
                        local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] * iVar3);
    bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x0;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    bufferParams.pNext = (void *)0x0;
    bufferParams._16_8_ = bufferParams._16_8_ & 0xffffffff00000000;
    bufferParams.usage = 1;
    bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    bufferParams._40_8_ = (ulong)(uint)bufferParams._44_4_ << 0x20;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
    bufferParams.size = size;
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&destAccess,vk_00,device_00,
                       &bufferParams,(VkAllocationCallbacks *)0x0);
    cmdBufferAllocateInfo.commandPool.m_internal._0_4_ =
         destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    cmdBufferAllocateInfo.commandPool.m_internal._4_4_ =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    cmdBufferAllocateInfo.level = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    cmdBufferAllocateInfo.commandBufferCount =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    cmdBufferAllocateInfo.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    cmdBufferAllocateInfo._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    cmdBufferAllocateInfo.pNext =
         (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)cmdBufferAllocateInfo.commandPool.m_internal;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)cmdBufferAllocateInfo._24_8_;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         cmdBufferAllocateInfo._0_8_;
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)cmdBufferAllocateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&destAccess);
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&cmdBufferAllocateInfo,vk_00,device_00,
               (VkBuffer)
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    (*pAVar9->_vptr_Allocator[3])(&destAccess,pAVar9,&cmdBufferAllocateInfo,1);
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    data_00._8_4_ = in_stack_fffffffffffffc60;
    data_00.ptr = (Allocation *)in_stack_fffffffffffffc58;
    data_00._12_4_ = in_stack_fffffffffffffc64;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
               data_00);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&destAccess);
    VVar5 = (*vk_00->_vptr_DeviceInterface[0xc])
                      (vk_00,device_00,
                       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
                       ,((bufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_memory).m_internal,
                       (bufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_offset);
    ::vk::checkResult(VVar5,
                      "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x7a);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo,vk_00,device_00,1,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)bufferParams._16_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)bufferParams.size;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         bufferParams._0_8_;
    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo);
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal =
         cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 1;
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)&destAccess,vk_00,device_00,&cmdBufferAllocateInfo);
    bufferParams.flags = destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    bufferParams._20_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    bufferParams.size._0_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    bufferParams.size._4_4_ = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    bufferParams.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    bufferParams._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    bufferParams.pNext = (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
              (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         (VkDevice)bufferParams._16_8_;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         bufferParams.size;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)bufferParams._0_8_;
    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)&destAccess);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&cmdBufferAllocateInfo,vk_00,device_00
                      ,0,(VkAllocationCallbacks *)0x0);
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
         (VkDevice)bufferParams._16_8_;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)bufferParams.size;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
         bufferParams._0_8_;
    fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&cmdBufferAllocateInfo);
    local_90[0] = 0x2c;
    local_88 = 0;
    local_80 = 0x80000004000;
    uStack_78 = 0xffffffffffffffff;
    local_70 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    local_68 = 0;
    bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    bufferParams.pNext = (void *)0x0;
    bufferParams.flags = 0;
    bufferParams._20_4_ = 0x1000;
    bufferParams.size = 0x700000000;
    bufferParams.usage = 0xffffffff;
    bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0x2000001000;
    cmdBufferAllocateInfo.level = 7;
    cmdBufferAllocateInfo.commandBufferCount = 5;
    bufferParams.pQueueFamilyIndices = (deUint32 *)0x1;
    local_1c0 = 0;
    local_1b8 = local_e8.super_ConstPixelBufferAccess.m_size.m_data[0];
    local_1b0 = 1;
    uStack_1a8 = 0x100000000;
    local_1a0 = 0;
    cmdBufferBeginInfo.flags = 1;
    cmdBufferBeginInfo._20_4_ = 0;
    cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
    local_198 = 0;
    cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    cmdBufferBeginInfo._4_4_ = 0;
    cmdBufferBeginInfo.pNext = (void *)0x0;
    local_194 = local_e8.super_ConstPixelBufferAccess.m_size.m_data[0];
    bufferParams._40_8_ = dVar2;
    local_60 = size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&destAccess,(TextureFormat *)&local_e8,&local_e8.super_ConstPixelBufferAccess.m_size,
               (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                m_data.ptr)->m_hostPtr);
    tcu::copy((EVP_PKEY_CTX *)&destAccess,(EVP_PKEY_CTX *)&local_e8);
    ::vk::flushMappedMemoryRange
              (vk_00,device_00,
               (VkDeviceMemory)
               ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                 m_data.ptr)->m_memory).m_internal,
               (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                m_data.ptr)->m_offset,size);
    VVar5 = (*vk_00->_vptr_DeviceInterface[0x49])
                      (vk_00,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                       &cmdBufferBeginInfo);
    ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xe8);
    (*vk_00->_vptr_DeviceInterface[0x6d])
              (vk_00,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,0x1000,0,0,0,1
               ,local_90,1,&bufferParams);
    (*vk_00->_vptr_DeviceInterface[0x62])
              (vk_00,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,dVar2,7
               ,1,&local_1c0);
    (*vk_00->_vptr_DeviceInterface[0x6d])
              (vk_00,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,0x2000,0,
               0,0,0,0,1,&cmdBufferAllocateInfo);
    VVar5 = (*vk_00->_vptr_DeviceInterface[0x4a])
                      (vk_00,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
    ::vk::checkResult(VVar5,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xec);
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_data = (void *)0x0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_format.order = LA;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    VVar5 = (*vk_00->_vptr_DeviceInterface[2])
                      (vk_00,pVVar10,1,&destAccess,
                       fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal)
    ;
    ::vk::checkResult(VVar5,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfb);
    VVar5 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,&fence,1,0xffffffffffffffff);
    ::vk::checkResult(VVar5,"vk.waitForFences(device, 1, &fence.get(), true, ~(0ull) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0xfc);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              (&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&bufferParams);
    pDVar7 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                       ((DescriptorSetLayoutBuilder *)&bufferParams,
                        VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,8);
    ::vk::DescriptorSetLayoutBuilder::build
              ((Move<vk::Handle<(vk::HandleType)19>_> *)&destAccess,pDVar7,vk,device,0);
    cmdBufferAllocateInfo.commandPool.m_internal._0_4_ =
         destAccess.super_ConstPixelBufferAccess.m_size.m_data[2];
    cmdBufferAllocateInfo.commandPool.m_internal._4_4_ =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0];
    cmdBufferAllocateInfo.level = destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
    cmdBufferAllocateInfo.commandBufferCount =
         destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    cmdBufferAllocateInfo.sType = destAccess.super_ConstPixelBufferAccess.m_format.order;
    cmdBufferAllocateInfo._4_4_ = destAccess.super_ConstPixelBufferAccess.m_format.type;
    cmdBufferAllocateInfo.pNext =
         (void *)destAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
    destAccess.super_ConstPixelBufferAccess.m_format.order = R;
    destAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
    destAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
    pMVar1 = &this->m_descriptorSetLayout;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
              (&pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_device = (VkDevice)cmdBufferAllocateInfo.commandPool.m_internal;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)cmdBufferAllocateInfo._24_8_;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
         cmdBufferAllocateInfo._0_8_;
    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)cmdBufferAllocateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&destAccess);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&bufferParams);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&destAccess);
    pDVar8 = ::vk::DescriptorPoolBuilder::addType
                       ((DescriptorPoolBuilder *)&destAccess,
                        VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
    ::vk::DescriptorPoolBuilder::build
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&cmdBufferAllocateInfo,pDVar8,vk,device,1,1)
    ;
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    this_01 = &this->m_descriptorPool;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
              (&this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)bufferParams._16_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)bufferParams.size;
    (this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
         bufferParams._0_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&cmdBufferAllocateInfo);
    std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
    ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                   *)&destAccess);
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&cmdBufferAllocateInfo,vk,device,
                      (VkDescriptorPool)
                      (this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
    bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
    bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
    bufferParams.sType = cmdBufferAllocateInfo.sType;
    bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
    bufferParams.pNext = cmdBufferAllocateInfo.pNext;
    cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    cmdBufferAllocateInfo._4_4_ = 0;
    cmdBufferAllocateInfo.pNext = (void *)0x0;
    cmdBufferAllocateInfo.commandPool.m_internal = 0;
    cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    cmdBufferAllocateInfo.commandBufferCount = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
              (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)bufferParams._16_8_;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = bufferParams.size;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
         = bufferParams._0_8_;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)bufferParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&cmdBufferAllocateInfo);
    makePipelineLayout(__return_storage_ptr__,vk,device,
                       (VkDescriptorSetLayout)
                       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                       m_internal);
    tcu::TextureLevel::~TextureLevel(&texture);
  }
  else {
    if (this->m_test == READ_UNIFORM) {
      ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                ((DescriptorSetLayoutBuilder *)&access);
      pDVar7 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                         ((DescriptorSetLayoutBuilder *)&access,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,8)
      ;
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&cmdBufferAllocateInfo,pDVar7,vk,device,0)
      ;
      bufferParams._16_8_ = cmdBufferAllocateInfo.commandPool.m_internal;
      bufferParams.size._0_4_ = cmdBufferAllocateInfo.level;
      bufferParams.size._4_4_ = cmdBufferAllocateInfo.commandBufferCount;
      bufferParams.sType = cmdBufferAllocateInfo.sType;
      bufferParams._4_4_ = cmdBufferAllocateInfo._4_4_;
      bufferParams.pNext = cmdBufferAllocateInfo.pNext;
      cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      cmdBufferAllocateInfo._4_4_ = 0;
      cmdBufferAllocateInfo.pNext = (void *)0x0;
      cmdBufferAllocateInfo.commandPool.m_internal = 0;
      cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
      cmdBufferAllocateInfo.commandBufferCount = 0;
      pMVar1 = &this->m_descriptorSetLayout;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
                (&pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)bufferParams._16_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)bufferParams.size;
      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
           bufferParams._0_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)bufferParams.pNext;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&cmdBufferAllocateInfo);
      ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
                ((DescriptorSetLayoutBuilder *)&access);
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
                ((DescriptorPoolBuilder *)&cmdBufferAllocateInfo);
      pDVar8 = ::vk::DescriptorPoolBuilder::addType
                         ((DescriptorPoolBuilder *)&cmdBufferAllocateInfo,
                          VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferParams,pDVar8,vk,device,1,1);
      access.super_ConstPixelBufferAccess.m_size.m_data[2] = bufferParams.flags;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = bufferParams._20_4_;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)bufferParams.size;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)(bufferParams.size >> 0x20);
      access.super_ConstPixelBufferAccess.m_format.order = bufferParams.sType;
      access.super_ConstPixelBufferAccess.m_format.type = bufferParams._4_4_;
      access.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = bufferParams.pNext;
      bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferParams._4_4_ = 0;
      bufferParams.pNext = (void *)0x0;
      bufferParams.flags = 0;
      bufferParams._20_4_ = 0;
      bufferParams.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
                (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)access.super_ConstPixelBufferAccess._16_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(access.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                             access.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
      m_internal = (deUint64)access.super_ConstPixelBufferAccess.m_format;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)access.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&bufferParams);
      std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     *)&cmdBufferAllocateInfo);
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferParams,vk,device,
                        (VkDescriptorPool)
                        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                        m_data.object.m_internal,
                        (VkDescriptorSetLayout)
                        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                        .m_data.object.m_internal);
      access.super_ConstPixelBufferAccess.m_size.m_data[2] = bufferParams.flags;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[0] = bufferParams._20_4_;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)bufferParams.size;
      access.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)(bufferParams.size >> 0x20);
      access.super_ConstPixelBufferAccess.m_format.order = bufferParams.sType;
      access.super_ConstPixelBufferAccess.m_format.type = bufferParams._4_4_;
      access.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = bufferParams.pNext;
      bufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferParams._4_4_ = 0;
      bufferParams.pNext = (void *)0x0;
      bufferParams.flags = 0;
      bufferParams._20_4_ = 0;
      bufferParams.size = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
                (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
           = (VkDevice)access.super_ConstPixelBufferAccess._16_8_;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = CONCAT44(access.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                            access.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal = (deUint64)access.super_ConstPixelBufferAccess.m_format;
      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)access.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&bufferParams);
      descriptorSetLayout.m_internal =
           (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
    }
    else {
      descriptorSetLayout.m_internal = 0;
    }
    makePipelineLayout(__return_storage_ptr__,vk,device,descriptorSetLayout);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> VaryingOutputCountTestInstance::createPipelineLayout (const DeviceInterface& vk, const VkDevice device)
{
	if (m_test == READ_UNIFORM)
	{
		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::Vec4				data[4]				=
														{
															tcu::Vec4(255, 0, 0, 0),
															tcu::Vec4(0, 255, 0, 0),
															tcu::Vec4(0, 0, 255, 0),
															tcu::Vec4(0, 0, 0, 255)
														};
		const tcu::UVec2			viewportSize		(4, 1);
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkImageUsageFlags		imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		Allocator&					memAlloc			= m_context.getDefaultAllocator();
		tcu::TextureLevel			texture				(texFormat, static_cast<int>(viewportSize.x()), static_cast<int>(viewportSize.y()));

		// Fill with data
		{
			tcu::PixelBufferAccess access = texture.getAccess();
			for (int x = 0; x < texture.getWidth(); ++x)
				access.setPixel(data[x], x, 0);
		}
		// Create image
		const VkImageCreateInfo			imageParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,								// const void*				pNext;
			0,										// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,						// VkImageType				imageType;
			format,									// VkFormat					format;
			{										// VkExtent3D				extent;
					viewportSize.x(),
					viewportSize.y(),
					1u,
			},
			1u,							// deUint32					mipLevels;
			1u,							// deUint32					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,		// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,	// VkImageTiling			tiling;
			imageUsageFlags,			// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,	// VkSharingMode			sharingMode;
			0u,							// deUint32					queueFamilyIndexCount;
			DE_NULL,					// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED	// VkImageLayout			initialLayout;
		};

		m_texture		= createImage(vk, device, &imageParams);
		m_allocation	= memAlloc.allocate(getImageMemoryRequirements(vk, device, *m_texture), MemoryRequirement::Any);
		VK_CHECK(vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset()));
		uploadImage(m_context, texture.getAccess(), *m_texture);

		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else
		return makePipelineLayout(vk, device);
}